

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# open62541.c
# Opt level: O0

UA_StatusCode
UA_Server_deleteReference
          (UA_Server *server,UA_NodeId sourceNodeId,UA_NodeId referenceTypeId,UA_Boolean isForward,
          UA_ExpandedNodeId targetNodeId,UA_Boolean deleteBidirectional)

{
  UA_StatusCode UVar1;
  undefined1 auStack_88 [4];
  UA_StatusCode retval;
  UA_DeleteReferencesItem item;
  UA_Boolean deleteBidirectional_local;
  UA_Boolean isForward_local;
  UA_Server *server_local;
  
  auStack_88._0_2_ = sourceNodeId.namespaceIndex;
  auStack_88._2_2_ = sourceNodeId._2_2_;
  retval = sourceNodeId.identifierType;
  item.sourceNodeId.namespaceIndex = sourceNodeId.identifier._0_2_;
  item.sourceNodeId._2_2_ = sourceNodeId.identifier._2_2_;
  item.sourceNodeId.identifierType = sourceNodeId.identifier._4_4_;
  item.sourceNodeId.identifier.string.length = (size_t)sourceNodeId.identifier.string.data;
  item.sourceNodeId.identifier.string.data = (UA_Byte *)referenceTypeId._0_8_;
  item.referenceTypeId.namespaceIndex = referenceTypeId.identifier._0_2_;
  item.referenceTypeId._2_2_ = referenceTypeId.identifier._2_2_;
  item.referenceTypeId.identifierType = referenceTypeId.identifier._4_4_;
  item.referenceTypeId.identifier.string.length = (size_t)referenceTypeId.identifier.string.data;
  item.referenceTypeId.identifier.guid.data4[0] = isForward;
  item._110_1_ = deleteBidirectional;
  item._111_1_ = isForward;
  memcpy(&item.isForward,&targetNodeId,0x30);
  item.targetNodeId.serverIndex._0_1_ = item._110_1_ & 1;
  UVar1 = deleteReference(server,&adminSession,(UA_DeleteReferencesItem *)auStack_88);
  return UVar1;
}

Assistant:

UA_StatusCode
UA_Server_deleteReference(UA_Server *server, const UA_NodeId sourceNodeId,
                          const UA_NodeId referenceTypeId,
                          UA_Boolean isForward, const UA_ExpandedNodeId targetNodeId,
                          UA_Boolean deleteBidirectional) {
    UA_DeleteReferencesItem item;
    item.sourceNodeId = sourceNodeId;
    item.referenceTypeId = referenceTypeId;
    item.isForward = isForward;
    item.targetNodeId = targetNodeId;
    item.deleteBidirectional = deleteBidirectional;
    UA_RCU_LOCK();
    UA_StatusCode retval = deleteReference(server, &adminSession, &item);
    UA_RCU_UNLOCK();
    return retval;
}